

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::RuleCharacterIterator::next
          (RuleCharacterIterator *this,int32_t options,UBool *isEscaped,UErrorCode *ec)

{
  SymbolTable *pSVar1;
  ParsePosition *pPVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  UnicodeString *pUVar7;
  int32_t local_cc;
  undefined1 local_c8 [4];
  int32_t offset;
  UnicodeString tempEscape;
  undefined1 local_78 [8];
  UnicodeString name;
  UChar32 c;
  UErrorCode *ec_local;
  UBool *isEscaped_local;
  int32_t options_local;
  RuleCharacterIterator *this_local;
  
  UVar3 = ::U_FAILURE(*ec);
  if (UVar3 == '\0') {
    name.fUnion._52_4_ = 0xffffffff;
    *isEscaped = '\0';
    do {
      while( true ) {
        name.fUnion._52_4_ = _current(this);
        iVar5 = 2;
        if ((uint)name.fUnion._52_4_ < 0x10000) {
          iVar5 = 1;
        }
        _advance(this,iVar5);
        if ((((name.fUnion._52_4_ != 0x24) || (this->buf != (UnicodeString *)0x0)) ||
            ((options & 1U) == 0)) || (this->sym == (SymbolTable *)0x0)) break;
        pSVar1 = this->sym;
        pUVar7 = this->text;
        pPVar2 = this->pos;
        uVar4 = UnicodeString::length(pUVar7);
        (*pSVar1->_vptr_SymbolTable[4])((UnicodeString *)local_78,pSVar1,pUVar7,pPVar2,(ulong)uVar4)
        ;
        iVar5 = UnicodeString::length((UnicodeString *)local_78);
        if (iVar5 == 0) {
          tempEscape.fUnion._48_4_ = 2;
        }
        else {
          this->bufPos = 0;
          iVar6 = (*this->sym->_vptr_SymbolTable[2])(this->sym,local_78);
          this->buf = (UnicodeString *)CONCAT44(extraout_var,iVar6);
          if (this->buf == (UnicodeString *)0x0) {
            *ec = U_UNDEFINED_VARIABLE;
            this_local._4_4_ = -1;
            tempEscape.fUnion._48_4_ = 1;
          }
          else {
            iVar5 = UnicodeString::length(this->buf);
            if (iVar5 == 0) {
              this->buf = (UnicodeString *)0x0;
            }
            tempEscape.fUnion._48_4_ = 3;
          }
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_78);
        if (tempEscape.fUnion._48_4_ == 1) {
          return this_local._4_4_;
        }
        if (tempEscape.fUnion._48_4_ == 2) goto LAB_0023131e;
      }
    } while (((options & 4U) != 0) &&
            (UVar3 = PatternProps::isWhiteSpace(name.fUnion._52_4_), UVar3 != '\0'));
    if ((name.fUnion._52_4_ == 0x5c) && ((options & 2U) != 0)) {
      UnicodeString::UnicodeString((UnicodeString *)local_c8);
      local_cc = 0;
      pUVar7 = lookahead(this,(UnicodeString *)local_c8,0xc);
      name.fUnion._52_4_ = UnicodeString::unescapeAt(pUVar7,&local_cc);
      jumpahead(this,local_cc);
      *isEscaped = '\x01';
      if ((int)name.fUnion._52_4_ < 0) {
        *ec = U_MALFORMED_UNICODE_ESCAPE;
        this_local._4_4_ = -1;
      }
      tempEscape.fUnion._49_3_ = 0;
      tempEscape.fUnion.fStackFields.fBuffer[0x17]._0_1_ = (int)name.fUnion._52_4_ < 0;
      UnicodeString::~UnicodeString((UnicodeString *)local_c8);
      if (tempEscape.fUnion._48_4_ != 0) {
        return this_local._4_4_;
      }
    }
LAB_0023131e:
    this_local._4_4_ = name.fUnion._52_4_;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

UChar32 RuleCharacterIterator::next(int32_t options, UBool& isEscaped, UErrorCode& ec) {
    if (U_FAILURE(ec)) return DONE;

    UChar32 c = DONE;
    isEscaped = FALSE;

    for (;;) {
        c = _current();
        _advance(U16_LENGTH(c));

        if (c == SymbolTable::SYMBOL_REF && buf == 0 &&
            (options & PARSE_VARIABLES) != 0 && sym != 0) {
            UnicodeString name = sym->parseReference(text, pos, text.length());
            // If name is empty there was an isolated SYMBOL_REF;
            // return it.  Caller must be prepared for this.
            if (name.length() == 0) {
                break;
            }
            bufPos = 0;
            buf = sym->lookup(name);
            if (buf == 0) {
                ec = U_UNDEFINED_VARIABLE;
                return DONE;
            }
            // Handle empty variable value
            if (buf->length() == 0) {
                buf = 0;
            }
            continue;
        }

        if ((options & SKIP_WHITESPACE) != 0 && PatternProps::isWhiteSpace(c)) {
            continue;
        }

        if (c == 0x5C /*'\\'*/ && (options & PARSE_ESCAPES) != 0) {
            UnicodeString tempEscape;
            int32_t offset = 0;
            c = lookahead(tempEscape, MAX_U_NOTATION_LEN).unescapeAt(offset);
            jumpahead(offset);
            isEscaped = TRUE;
            if (c < 0) {
                ec = U_MALFORMED_UNICODE_ESCAPE;
                return DONE;
            }
        }

        break;
    }

    return c;
}